

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_socket_comm.c
# Opt level: O0

int tpm_socket_read(TPM_SOCKET_HANDLE handle,uchar *tpm_bytes,uint32_t bytes_len)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  size_t index;
  LOGGER_LOG l;
  int result;
  uint32_t bytes_len_local;
  uchar *tpm_bytes_local;
  TPM_SOCKET_HANDLE handle_local;
  
  if (((handle == (TPM_SOCKET_HANDLE)0x0) || (tpm_bytes == (uchar *)0x0)) || (bytes_len == 0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_socket_comm.c"
                ,"tpm_socket_read",0x100,1,
                "Invalid argument specified handle: %p, tpm_bytes: %p, bytes_len: %d",handle,
                tpm_bytes,bytes_len);
    }
    l._0_4_ = 0x101;
  }
  else {
    l._0_4_ = 0x106;
    for (l_1 = (LOGGER_LOG)0x0; l_1 < (LOGGER_LOG)0x2; l_1 = l_1 + 1) {
      if ((ulong)bytes_len <= handle->recv_length) {
        memcpy(tpm_bytes,handle->recv_bytes,(ulong)bytes_len);
        remove_from_buffer(handle,(ulong)bytes_len);
        return 0;
      }
      iVar1 = read_socket_bytes(handle);
      if (iVar1 != 0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_socket_comm.c"
                    ,"tpm_socket_read",0x114,1,"Failure reading socket bytes.");
        }
        return 0x115;
      }
    }
  }
  return (int)l;
}

Assistant:

int tpm_socket_read(TPM_SOCKET_HANDLE handle, unsigned char* tpm_bytes, uint32_t bytes_len)
{
    int result;
    if (handle == NULL || tpm_bytes == NULL || bytes_len == 0)
    {
        LogError("Invalid argument specified handle: %p, tpm_bytes: %p, bytes_len: %d", handle, tpm_bytes, bytes_len);
        result = MU_FAILURE;
    }
    else
    {
        // Do we have enough bytes cached
        result = MU_FAILURE;
        for (size_t index = 0; index < 2; index++)
        {
            if (handle->recv_length >= bytes_len)
            {
                memcpy(tpm_bytes, handle->recv_bytes, bytes_len);
                remove_from_buffer(handle, bytes_len);
                result = 0;
                break;
            }
            else
            {
                if (read_socket_bytes(handle))
                {
                    LogError("Failure reading socket bytes.");
                    result = MU_FAILURE;
                    break;
                }
            }
        }
    }
    return result;
}